

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

void nghttp2_frame_priority_update_init
               (nghttp2_extension *frame,int32_t stream_id,uint8_t *field_value,
               size_t field_value_len)

{
  int32_t *piVar1;
  nghttp2_ext_priority_update *priority_update;
  size_t field_value_len_local;
  uint8_t *field_value_local;
  int32_t stream_id_local;
  nghttp2_extension *frame_local;
  
  nghttp2_frame_hd_init(&frame->hd,field_value_len + 4,'\x10','\0',0);
  piVar1 = (int32_t *)frame->payload;
  *piVar1 = stream_id;
  *(uint8_t **)(piVar1 + 2) = field_value;
  *(size_t *)(piVar1 + 4) = field_value_len;
  return;
}

Assistant:

void nghttp2_frame_priority_update_init(nghttp2_extension *frame,
                                        int32_t stream_id, uint8_t *field_value,
                                        size_t field_value_len) {
  nghttp2_ext_priority_update *priority_update;

  nghttp2_frame_hd_init(&frame->hd, 4 + field_value_len,
                        NGHTTP2_PRIORITY_UPDATE, NGHTTP2_FLAG_NONE, 0);

  priority_update = frame->payload;
  priority_update->stream_id = stream_id;
  priority_update->field_value = field_value;
  priority_update->field_value_len = field_value_len;
}